

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

MTBDD mtbdd_enum_next(MTBDD dd,MTBDD variables,uint8_t *arr,mtbdd_enum_filter_cb filter_cb)

{
  int iVar1;
  MTBDD variables_00;
  mtbddnode_t pmVar2;
  MTBDD MVar3;
  mtbddnode_t n_1;
  MTBDD res;
  mtbddnode_t n;
  mtbdd_enum_filter_cb filter_cb_local;
  uint8_t *arr_local;
  MTBDD variables_local;
  MTBDD dd_local;
  
  iVar1 = mtbdd_isleaf(dd);
  if (iVar1 == 0) {
    if (variables == 0x8000000000000000) {
      dd_local = 0;
    }
    else {
      if (variables == 0x8000000000000000) {
        __assert_fail("variables != mtbdd_true",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_mtbdd.c"
                      ,0xa1f,"MTBDD mtbdd_enum_next(MTBDD, MTBDD, uint8_t *, mtbdd_enum_filter_cb)")
        ;
      }
      variables_00 = mtbdd_gethigh(variables);
      if (*arr == '\0') {
        pmVar2 = MTBDD_GETNODE(dd);
        MVar3 = mtbddnode_followlow(dd,pmVar2);
        dd_local = mtbdd_enum_next(MVar3,variables_00,arr + 1,filter_cb);
        if (dd_local == 0) {
          MVar3 = mtbddnode_followhigh(dd,pmVar2);
          dd_local = mtbdd_enum_first(MVar3,variables_00,arr + 1,filter_cb);
          if (dd_local == 0) {
            dd_local = 0;
          }
          else {
            *arr = '\x01';
          }
        }
      }
      else if (*arr == '\x01') {
        pmVar2 = MTBDD_GETNODE(dd);
        MVar3 = mtbddnode_followhigh(dd,pmVar2);
        dd_local = mtbdd_enum_next(MVar3,variables_00,arr + 1,filter_cb);
      }
      else {
        dd_local = mtbdd_enum_next(dd,variables_00,arr + 1,filter_cb);
      }
    }
  }
  else {
    dd_local = 0;
  }
  return dd_local;
}

Assistant:

MTBDD
mtbdd_enum_next(MTBDD dd, MTBDD variables, uint8_t *arr, mtbdd_enum_filter_cb filter_cb)
{
    if (mtbdd_isleaf(dd)) {
        // we find the leaf in 'enum_next', then we've seen it before...
        return mtbdd_false;
    } else if (variables == mtbdd_true) {
        // in the case of partial evaluation... treat like a leaf
        return mtbdd_false;
    } else {
        // if variables == true, then dd must be a leaf. But then this line is unreachable.
        // if this assertion fails, then <variables> is not the support of <dd>.
        assert(variables != mtbdd_true);

        variables = mtbdd_gethigh(variables);

        if (*arr == 0) {
            // previous was low
            mtbddnode_t n = MTBDD_GETNODE(dd);
            MTBDD res = mtbdd_enum_next(node_getlow(dd, n), variables, arr+1, filter_cb);
            if (res != mtbdd_false) {
                return res;
            } else {
                // try to find new in high branch
                res = mtbdd_enum_first(node_gethigh(dd, n), variables, arr+1, filter_cb);
                if (res != mtbdd_false) {
                    *arr = 1;
                    return res;
                } else {
                    return mtbdd_false;
                }
            }
        } else if (*arr == 1) {
            // previous was high
            mtbddnode_t n = MTBDD_GETNODE(dd);
            return mtbdd_enum_next(node_gethigh(dd, n), variables, arr+1, filter_cb);
        } else {
            // previous was either
            return mtbdd_enum_next(dd, variables, arr+1, filter_cb);
        }
    }
}